

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Abs_value_patch(int g_a,int *lo,int *hi)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_60 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = (long)lo[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  pIVar2 = aIStack_98 + IVar1;
  for (lVar4 = 0; pIVar2 = pIVar2 + -1, lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = (long)hi[lVar4] + 1;
  }
  pnga_abs_value_patch((long)g_a,local_58,aIStack_98);
  return;
}

Assistant:

void GA_Abs_value_patch(int g_a, int *lo, int *hi)
{
    Integer a = (Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    wnga_abs_value_patch(a,_ga_lo, _ga_hi);
}